

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_draw_list_alloc_vertices(nk_draw_list *list,nk_size count)

{
  void *vtx;
  nk_size count_local;
  nk_draw_list *list_local;
  
  if (list != (nk_draw_list *)0x0) {
    if (list == (nk_draw_list *)0x0) {
      list_local = (nk_draw_list *)0x0;
    }
    else {
      list_local = (nk_draw_list *)
                   nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,(list->config).vertex_size * count
                                   ,(list->config).vertex_alignment);
      if (list_local == (nk_draw_list *)0x0) {
        list_local = (nk_draw_list *)0x0;
      }
      else {
        list->vertex_count = (int)count + list->vertex_count;
      }
    }
    return list_local;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x1a57,"void *nk_draw_list_alloc_vertices(struct nk_draw_list *, nk_size)");
}

Assistant:

NK_INTERN void*
nk_draw_list_alloc_vertices(struct nk_draw_list *list, nk_size count)
{
    void *vtx;
    NK_ASSERT(list);
    if (!list) return 0;
    vtx = nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT,
        list->config.vertex_size*count, list->config.vertex_alignment);
    if (!vtx) return 0;
    list->vertex_count += (unsigned int)count;
    return vtx;
}